

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

uint32_t decodeUTF8(char **s)

{
  uint32_t uVar1;
  uint32_t count;
  uint32_t codepoint;
  char **s_local;
  
  codepoint = 0;
  count = 0;
  uVar1 = count;
  do {
    count = uVar1;
    codepoint = codepoint * 0x40 + (uint)(byte)**s;
    *s = *s + 1;
    uVar1 = count + 1;
  } while (((int)**s & 0xc0U) == 0x80);
  return codepoint - decodeUTF8::offsets[count];
}

Assistant:

static uint32_t decodeUTF8(const char** s)
{
    uint32_t codepoint = 0, count = 0;
    static const uint32_t offsets[] =
    {
        0x00000000u, 0x00003080u, 0x000e2080u,
        0x03c82080u, 0xfa082080u, 0x82082080u
    };

    do
    {
        codepoint = (codepoint << 6) + (unsigned char) **s;
        (*s)++;
        count++;
    } while ((**s & 0xc0) == 0x80);

    assert(count <= 6);
    return codepoint - offsets[count - 1];
}